

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O0

void run_word<wchar_t>(string *original,int *none,int *num,int *word,int *kana,int *ideo,locale *l,
                      boundary_type b)

{
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __last;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __first;
  byte bVar1;
  string *e;
  reference pvVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  locale *in_stack_00000008;
  list<wchar_t,_std::allocator<wchar_t>_> lst;
  int i;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> test_string;
  vector<int,_std::allocator<int>_> masks;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  chunks;
  vector<int,_std::allocator<int>_> pos;
  locale *in_stack_00001f78;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *in_stack_00001f80;
  vector<int,_std::allocator<int>_> *in_stack_00001f88;
  vector<int,_std::allocator<int>_> *in_stack_00001f90;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  in_stack_00001f98;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  in_stack_00001fa0;
  boundary_type in_stack_00001fb0;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe50;
  vector<int,_std::allocator<int>_> *this;
  uint local_17c;
  uint in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  uint in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  uint in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  uint in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea4;
  locale local_140 [8];
  undefined8 local_138;
  undefined8 local_130;
  locale local_128 [8];
  _List_node_base *local_120;
  _List_node_base *local_118;
  allocator<wchar_t> local_109;
  undefined8 local_108;
  undefined8 local_100;
  vector<int,_std::allocator<int>_> local_f8;
  uint local_dc;
  undefined4 local_d8;
  locale local_c8 [8];
  wstring local_c0 [36];
  int local_9c;
  wstring local_98 [104];
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x134ba8);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)0x134bb5);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x134bc2);
  std::__cxx11::wstring::wstring(local_98);
  local_9c = 0;
  while( true ) {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    e = (string *)(local_8 + (long)local_9c * 0x20);
    std::locale::locale(local_c8,in_stack_00000008);
    to_correct_string<wchar_t>
              (e,(locale *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)in_stack_fffffffffffffe50,
                (value_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    std::__cxx11::wstring::~wstring(local_c0);
    std::locale::~locale(local_c8);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ::back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)in_stack_fffffffffffffe50);
    std::__cxx11::wstring::operator+=(local_98,(wstring *)pvVar2);
    local_d8 = std::__cxx11::wstring::size();
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_fffffffffffffe50,
               (value_type_conflict *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
    ;
    if (local_10 == 0) {
      in_stack_fffffffffffffea0 = 0;
    }
    else {
      in_stack_fffffffffffffea0 = *(int *)(local_10 + (long)local_9c * 4) * 0xf;
    }
    if (local_18 == 0) {
      in_stack_fffffffffffffe9c = 0;
    }
    else {
      in_stack_fffffffffffffe9c = *(int *)(local_18 + (long)local_9c * 4) * 0xf0;
    }
    in_stack_fffffffffffffe98 = in_stack_fffffffffffffea0 | in_stack_fffffffffffffe9c;
    if (local_20 == 0) {
      in_stack_fffffffffffffe94 = 0;
    }
    else {
      in_stack_fffffffffffffe94 = *(int *)(local_20 + (long)local_9c * 4) * 0xf00;
    }
    in_stack_fffffffffffffe90 = in_stack_fffffffffffffe98 | in_stack_fffffffffffffe94;
    if (local_28 == 0) {
      in_stack_fffffffffffffe8c = 0;
    }
    else {
      in_stack_fffffffffffffe8c = *(int *)(local_28 + (long)local_9c * 4) * 0xf000;
    }
    in_stack_fffffffffffffe88 = in_stack_fffffffffffffe90 | in_stack_fffffffffffffe8c;
    if (local_30 == 0) {
      local_17c = 0;
    }
    else {
      local_17c = *(int *)(local_30 + (long)local_9c * 4) * 0xf0000;
    }
    local_dc = in_stack_fffffffffffffe88 | local_17c;
    in_stack_fffffffffffffea4 = in_stack_fffffffffffffea0;
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_fffffffffffffe50,
               (value_type_conflict *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
    ;
    local_9c = local_9c + 1;
  }
  local_100 = std::__cxx11::wstring::begin();
  local_108 = std::__cxx11::wstring::end();
  std::allocator<wchar_t>::allocator();
  __first._M_current._4_4_ = in_stack_fffffffffffffea4;
  __first._M_current._0_4_ = in_stack_fffffffffffffea0;
  __last._M_current._4_4_ = in_stack_fffffffffffffe9c;
  __last._M_current._0_4_ = in_stack_fffffffffffffe98;
  std::__cxx11::list<wchar_t,std::allocator<wchar_t>>::
  list<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,void>
            ((list<wchar_t,_std::allocator<wchar_t>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),__first,__last,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::allocator<wchar_t>::~allocator(&local_109);
  this = &local_f8;
  local_118 = (_List_node_base *)
              std::__cxx11::list<wchar_t,_std::allocator<wchar_t>_>::begin
                        ((list<wchar_t,_std::allocator<wchar_t>_> *)
                         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_120 = (_List_node_base *)
              std::__cxx11::list<wchar_t,_std::allocator<wchar_t>_>::end
                        ((list<wchar_t,_std::allocator<wchar_t>_> *)
                         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  std::locale::locale(local_128,in_stack_00000008);
  test_word_container<wchar_t,std::_List_iterator<wchar_t>>
            ((_List_iterator<wchar_t>)in_stack_00001fa0._M_current,
             (_List_iterator<wchar_t>)in_stack_00001f98._M_current,in_stack_00001f90,
             in_stack_00001f88,in_stack_00001f80,in_stack_00001f78,in_stack_00001fb0);
  std::locale::~locale(local_128);
  local_130 = std::__cxx11::wstring::begin();
  local_138 = std::__cxx11::wstring::end();
  std::locale::locale(local_140,in_stack_00000008);
  test_word_container<wchar_t,__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
            (in_stack_00001fa0,in_stack_00001f98,in_stack_00001f90,in_stack_00001f88,
             in_stack_00001f80,in_stack_00001f78,in_stack_00001fb0);
  std::locale::~locale(local_140);
  std::__cxx11::list<wchar_t,_std::allocator<wchar_t>_>::~list
            ((list<wchar_t,_std::allocator<wchar_t>_> *)0x13501f);
  std::__cxx11::wstring::~wstring(local_98);
  std::vector<int,_std::allocator<int>_>::~vector(this);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)this);
  std::vector<int,_std::allocator<int>_>::~vector(this);
  return;
}

Assistant:

void run_word(std::string *original,int *none,int *num,int *word,int *kana,int *ideo,std::locale l,lb::boundary_type b=lb::word)
{
    std::vector<int> pos;
    std::vector<std::basic_string<Char> > chunks;
    std::vector<int> masks;
    std::basic_string<Char> test_string;
    for(int i=0;!original[i].empty();i++) {
        chunks.push_back(to_correct_string<Char>(original[i],l));
        test_string+=chunks.back();
        pos.push_back(test_string.size());
        masks.push_back(
              ( none ? none[i]*15 : 0)
            | ( num  ? ((num[i]*15)  << 4) : 0) 
            | ( word ? ((word[i]*15) << 8) : 0) 
            | ( kana ? ((kana[i]*15) << 12) : 0)
            | ( ideo ? ((ideo[i]*15) << 16) : 0)
        );
    }

    std::list<Char> lst(test_string.begin(),test_string.end());
    test_word_container<Char>(lst.begin(),lst.end(),pos,masks,chunks,l,b);
    test_word_container<Char>(test_string.begin(),test_string.end(),pos,masks,chunks,l,b);
}